

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_clear.c
# Opt level: O3

int cmd_clear_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  char ***argv_p;
  ushort uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int argc;
  int opt_index;
  option options [5];
  int local_f4;
  char ***local_f0;
  int *local_e8;
  undefined1 local_dc [4];
  undefined1 local_d8 [168];
  
  local_f4 = 0;
  memcpy(local_d8,&PTR_anon_var_dwarf_13d_0011c3e0,0xa0);
  yo->ctx_options = 4;
  argv_p = &yo->argv;
  iVar2 = parse_cmdline(cmdline,&local_f4,argv_p);
  if (iVar2 == 0) {
    local_f0 = posv;
    local_e8 = posc;
    do {
      while (iVar3 = getopt_long(local_f4,*argv_p,commands[9].optstring,local_d8,local_dc),
            iVar2 = _optind, 0x68 < iVar3) {
        if (iVar3 == 0x79) {
          uVar1 = yo->ctx_options & 0xfffb;
        }
        else {
          if (iVar3 != 0x69) goto LAB_00105aab;
          uVar1 = yo->ctx_options;
          if ((uVar1 & 2) == 0) {
            uVar1 = uVar1 | 2;
          }
          else {
            uVar1 = (uVar1 & 0xfffc) + 1;
          }
        }
        yo->ctx_options = uVar1;
      }
      if (iVar3 != 0x59) {
        if (iVar3 == -1) {
          *local_f0 = *argv_p + _optind;
          *local_e8 = local_f4 - iVar2;
          return 0;
        }
        if (iVar3 == 0x68) {
          puts(
              "Usage: clear [-i] [-y]\n                  Replace the current context with an empty one, searchpaths\n                  are not kept.\n\n  -i, --make-implemented\n                When loading a module into the context, the imported \'referenced\'\n                modules will also be implemented. If specified a second time,\n                all the modules will be implemented.\n  -y, --yang-library\n                  Load and implement internal \"ietf-yang-library\" YANG module.\n                  Note that this module includes definitions of mandatory state\n                  data that can result in unexpected data validation errors.\n  -Y FILE, --yang-library-file=FILE\n                Parse FILE with \"ietf-yang-library\" data and use them to\n                create an exact YANG schema context. Searchpaths defined so far\n                are used, but then deleted."
              );
          return 1;
        }
LAB_00105aab:
        pcVar4 = "Unknown option.";
        goto LAB_00105abb;
      }
      *(byte *)&yo->ctx_options = (byte)yo->ctx_options & 0xfb;
      pcVar4 = _optarg;
      yo->yang_lib_file = _optarg;
    } while (pcVar4 != (char *)0x0);
    pcVar4 = "Memory allocation error.";
LAB_00105abb:
    iVar2 = 1;
    yl_log('\x01',pcVar4);
  }
  return iVar2;
}

Assistant:

int
cmd_clear_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"make-implemented",    no_argument, NULL, 'i'},
        {"yang-library",        no_argument, NULL, 'y'},
        {"yang-library-file",   no_argument, NULL, 'Y'},
        {"help",             no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    yo->ctx_options = LY_CTX_NO_YANGLIBRARY;

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_CLEAR].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'i':
            if (yo->ctx_options & LY_CTX_REF_IMPLEMENTED) {
                yo->ctx_options &= ~LY_CTX_REF_IMPLEMENTED;
                yo->ctx_options |= LY_CTX_ALL_IMPLEMENTED;
            } else {
                yo->ctx_options |= LY_CTX_REF_IMPLEMENTED;
            }
            break;
        case 'y':
            yo->ctx_options &= ~LY_CTX_NO_YANGLIBRARY;
            break;
        case 'Y':
            yo->ctx_options &= ~LY_CTX_NO_YANGLIBRARY;
            yo->yang_lib_file = optarg;
            if (!yo->yang_lib_file) {
                YLMSG_E("Memory allocation error.");
                return 1;
            }
            break;
        case 'h':
            cmd_clear_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return rc;
}